

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_promise_resolve_thenable_job(JSContext *ctx,int argc,JSValue *argv)

{
  JSRuntime *pJVar1;
  JSValue JVar2;
  int iVar3;
  JSValue JVar4;
  JSValue args [2];
  JSValueUnion local_48;
  int64_t iStack_40;
  
  JVar2 = argv[1];
  JVar4 = argv[2];
  iVar3 = js_create_resolving_functions(ctx,args,*argv);
  if (iVar3 < 0) {
    JVar4 = (JSValue)(ZEXT816(6) << 0x40);
  }
  else {
    JVar4 = JS_Call(ctx,JVar4,JVar2,2,args);
    if ((int)JVar4.tag == 6) {
      pJVar1 = ctx->rt;
      local_48 = (JSValueUnion)(pJVar1->current_exception).u.ptr;
      iStack_40 = (pJVar1->current_exception).tag;
      (pJVar1->current_exception).u.int32 = 0;
      (pJVar1->current_exception).tag = 2;
      JVar4 = JS_Call(ctx,args[1],(JSValue)(ZEXT816(3) << 0x40),1,(JSValue *)&local_48);
      JVar2.tag = iStack_40;
      JVar2.u.float64 = local_48.float64;
      JS_FreeValue(ctx,JVar2);
    }
    JS_FreeValue(ctx,args[0]);
    JS_FreeValue(ctx,args[1]);
  }
  return JVar4;
}

Assistant:

static JSValue js_promise_resolve_thenable_job(JSContext *ctx,
                                               int argc, JSValueConst *argv)
{
    JSValueConst promise, thenable, then;
    JSValue args[2], res;

#ifdef DUMP_PROMISE
    printf("js_promise_resolve_thenable_job\n");
#endif
    assert(argc == 3);
    promise = argv[0];
    thenable = argv[1];
    then = argv[2];
    if (js_create_resolving_functions(ctx, args, promise) < 0)
        return JS_EXCEPTION;
    res = JS_Call(ctx, then, thenable, 2, (JSValueConst *)args);
    if (JS_IsException(res)) {
        JSValue error = JS_GetException(ctx);
        res = JS_Call(ctx, args[1], JS_UNDEFINED, 1, (JSValueConst *)&error);
        JS_FreeValue(ctx, error);
    }
    JS_FreeValue(ctx, args[0]);
    JS_FreeValue(ctx, args[1]);
    return res;
}